

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O0

command_node * __thiscall
libchars::command_node::add(command_node *this,string *word,filter_t mask_,bool hidden_)

{
  command_node *pcVar1;
  size_t sVar2;
  debug *pdVar3;
  command_node *pcVar4;
  char *pcVar5;
  ulong uVar6;
  ulong uVar7;
  command_node *pcVar8;
  long lVar9;
  command_node *pcVar10;
  bool bVar11;
  double dVar12;
  double __x;
  double __x_00;
  double __x_01;
  double __x_02;
  double __x_03;
  string local_1c0;
  command_node *local_1a0;
  command_node *nn_1;
  command_node *tail__;
  command_node *head__;
  string part_1;
  size_t ri_1;
  string local_140;
  string local_120;
  string local_100 [32];
  command_node *local_e0;
  command_node *nn;
  string part;
  string local_a8;
  ulong local_88;
  size_t ri;
  command_node *pcStack_78;
  char c;
  command_node *n;
  command_node *prev;
  command_node *root;
  size_t si;
  size_t wi;
  size_t ti;
  filter_t fStack_40;
  bool hidden__local;
  filter_t mask__local;
  string *word_local;
  command_node *this_local;
  
  ti._7_1_ = hidden_;
  fStack_40 = mask_;
  mask__local = (filter_t)word;
  word_local = &this->part;
  pdVar3 = debug::initialize(0);
  dVar12 = (double)std::__cxx11::string::c_str();
  debug::log(pdVar3,dVar12);
  this->mask = fStack_40 | this->mask;
  if (this->head == (command_node *)0x0) {
    pdVar3 = debug::initialize(0);
    debug::log(pdVar3,__x);
    this_local = add_node(this,this,(string *)mask__local,fStack_40,(bool)(ti._7_1_ & 1));
  }
  else {
    wi = 0;
    si = 0;
    root = (command_node *)0x0;
    n = (command_node *)0x0;
    pcStack_78 = this->head;
    prev = this;
    while( true ) {
      while( true ) {
        while( true ) {
          pcVar10 = root;
          bVar11 = false;
          if (pcStack_78 != (command_node *)0x0) {
            pcVar4 = (command_node *)std::__cxx11::string::length();
            bVar11 = pcVar10 < pcVar4;
          }
          if (!bVar11) {
            pdVar3 = debug::initialize(0);
            dVar12 = (double)std::__cxx11::string::length();
            debug::log(pdVar3,dVar12);
            if (pcStack_78 == (command_node *)0x0) {
              pcStack_78 = prev;
            }
            pdVar3 = debug::initialize(0);
            dVar12 = (double)std::__cxx11::string::length();
            debug::log(pdVar3,dVar12);
            pcVar4 = root;
            pcVar8 = (command_node *)std::__cxx11::string::length();
            sVar2 = si;
            pcVar1 = root;
            pcVar10 = pcStack_78;
            if (pcVar4 < pcVar8) {
              pcStack_78->mask = pcStack_78->mask | fStack_40;
              std::__cxx11::string::substr((ulong)&ri_1,mask__local);
              this_local = add_node(this,pcVar10,(string *)&ri_1,fStack_40,(bool)(ti._7_1_ & 1));
              std::__cxx11::string::~string((string *)&ri_1);
              return this_local;
            }
            lVar9 = std::__cxx11::string::length();
            if (pcVar1 < (command_node *)(sVar2 + lVar9)) {
              pdVar3 = debug::initialize(0);
              debug::log(pdVar3,__x_02);
              part_1.field_2._8_8_ = (long)root - si;
              std::__cxx11::string::string((string *)&head__,(string *)pcStack_78);
              std::__cxx11::string::assign((string *)pcStack_78,(ulong)&head__,0);
              pcVar10 = pcStack_78;
              tail__ = pcStack_78->head;
              nn_1 = pcStack_78->tail;
              pcStack_78->tail = (command_node *)0x0;
              pcStack_78->head = (command_node *)0x0;
              std::__cxx11::string::substr((ulong)&local_1c0,(ulong)&head__);
              pcVar10 = add_node(this,pcVar10,&local_1c0,pcStack_78->mask,
                                 (bool)(pcStack_78->hidden & 1));
              std::__cxx11::string::~string((string *)&local_1c0);
              pcVar10->cmd = pcStack_78->cmd;
              pcVar10->head = tail__;
              pcVar10->tail = nn_1;
              pcVar10->start = pcStack_78->start;
              pcStack_78->mask = fStack_40 | pcStack_78->mask;
              pcStack_78->cmd = (command *)0x0;
              pcStack_78->hidden = (bool)(ti._7_1_ & 1);
              pcStack_78->start = (command_node *)0x0;
              local_1a0 = pcVar10;
              std::__cxx11::string::~string((string *)&head__);
            }
            else {
              pdVar3 = debug::initialize(0);
              debug::log(pdVar3,__x_03);
              pcStack_78->mask = fStack_40 | pcStack_78->mask;
            }
            return pcStack_78;
          }
          pdVar3 = debug::initialize(0);
          debug::log(pdVar3,__x_00);
          pcVar5 = (char *)std::__cxx11::string::at(mask__local);
          ri._7_1_ = *pcVar5;
          uVar6 = wi - si;
          local_88 = uVar6;
          if (uVar6 != 0) break;
          pcVar5 = (char *)std::__cxx11::string::at((ulong)pcStack_78);
          pcVar10 = prev;
          if (*pcVar5 == ri._7_1_) {
            root = (command_node *)&(root->part).field_0x1;
            wi = wi + 1;
          }
          else {
            if (pcStack_78->next == (command_node *)0x0) {
              std::__cxx11::string::substr((ulong)&local_a8,mask__local);
              this_local = add_node(this,pcVar10,&local_a8,fStack_40,(bool)(ti._7_1_ & 1));
              std::__cxx11::string::~string((string *)&local_a8);
              return this_local;
            }
            n = pcStack_78;
            pcStack_78 = pcStack_78->next;
          }
        }
        uVar7 = std::__cxx11::string::length();
        pcVar10 = pcStack_78;
        if (uVar7 <= uVar6) break;
        pcVar5 = (char *)std::__cxx11::string::at((ulong)pcStack_78);
        if (*pcVar5 != ri._7_1_) {
          pdVar3 = debug::initialize(0);
          debug::log(pdVar3,__x_01);
          std::__cxx11::string::string((string *)&nn,(string *)pcStack_78);
          pcVar10 = (command_node *)operator_new(0x58);
          command_node(pcVar10);
          local_e0 = pcVar10;
          std::__cxx11::string::assign((string *)pcVar10,(ulong)&nn,0);
          pcVar10 = pcStack_78;
          local_e0->mask = pcStack_78->mask | fStack_40;
          local_e0->next = pcStack_78->next;
          std::__cxx11::string::substr((ulong)local_100,(ulong)&nn);
          std::__cxx11::string::assign((string *)pcVar10);
          std::__cxx11::string::~string(local_100);
          pcStack_78->next = (command_node *)0x0;
          add_node(this,local_e0,pcStack_78);
          pcVar10 = local_e0;
          if (n == (command_node *)0x0) {
            prev->head = local_e0;
          }
          else {
            n->next = local_e0;
          }
          if (local_e0->next == (command_node *)0x0) {
            prev->tail = local_e0;
          }
          std::__cxx11::string::substr((ulong)&local_120,mask__local);
          this_local = add_node(this,pcVar10,&local_120,fStack_40,(bool)(ti._7_1_ & 1));
          std::__cxx11::string::~string((string *)&local_120);
          std::__cxx11::string::~string((string *)&nn);
          return this_local;
        }
        root = (command_node *)&(root->part).field_0x1;
        wi = wi + 1;
      }
      if (pcStack_78->head == (command_node *)0x0) break;
      si = wi;
      prev = pcStack_78;
      pcStack_78->mask = fStack_40 | pcStack_78->mask;
      n = (command_node *)0x0;
      pcStack_78 = pcStack_78->head;
    }
    pcStack_78->mask = pcStack_78->mask | fStack_40;
    std::__cxx11::string::substr((ulong)&local_140,mask__local);
    this_local = add_node(this,pcVar10,&local_140,fStack_40,(bool)(ti._7_1_ & 1));
    std::__cxx11::string::~string((string *)&local_140);
  }
  return this_local;
}

Assistant:

command_node *command_node::add(const std::string &word, command::filter_t mask_, bool hidden_)
    {
        LC_LOG_VERBOSE("+word[%s] mask[0x%08x] hidden[%s]",word.c_str(),mask_,hidden_?"true":"false");

        mask |= mask_; // always update root mask

        if (head == NULL) {
            // no need to search; just add whole word
            LC_LOG_VERBOSE("add-new-root");
            return add_node(this,word,mask_,hidden_);
        }
        else {
            size_t ti = 0; // tree index (cumulative)
            size_t wi = 0; // index of first character in partial word (wi <= ti)
            size_t si = 0; // index into search word (0..length)

            command_node *root = this;
            command_node *prev = NULL;
            command_node *n = head;

            while (n != NULL && si < word.length()) {
                LC_LOG_VERBOSE("root[%p] prev[%p] n[%p] ti[%zu] wi[%zu] si[%zu]",root,prev,n,ti,wi,si);
                char c = word.at(si);
                size_t ri = (ti - wi); // index relative to partial dictionary word
                if (ri == 0) {
                    // check for match in first letter, else go to next command_node
                    if (n->part.at(ri) == c) {
                        ++si;
                        ++ti;
                    }
                    else if (n->next == NULL) {
                        return add_node(root,word.substr(si),mask_,hidden_);
                    }
                    else {
                        prev = n;
                        n = n->next;
                    }
                }
                else if (ri < n->part.length()) {
                    // check for match in current part
                    if (n->part.at(ri) == c) {
                        ++si;
                        ++ti;
                    }
                    else {
                        // mismatch = split + add new part
                        LC_LOG_VERBOSE("mismatch->split");
                        std::string part = n->part;
                        command_node *nn = new command_node;
                        nn->part.assign(part,0,ri);
                        nn->mask = n->mask | mask_;
                        nn->next = n->next;
                        n->part.assign(part.substr(ri));
                        n->next = NULL;
                        // split = move existing command_node down one level
                        add_node(nn,n);
                        if (prev == NULL) {
                            root->head = nn;
                        }
                        else {
                            prev->next = nn;
                        }
                        if (nn->next == NULL) {
                            root->tail = nn;
                        }
                        return add_node(nn,word.substr(si),mask_,hidden_);
                    }
                }
                else {
                    // reached end of current part; go down one level if possible
                    if (n->head == NULL) {
                        n->mask |= mask_;
                        return add_node(n,word.substr(si),mask_,hidden_);
                    }
                    else {
                        wi = ti;
                        root = n;
                        root->mask |= mask_;
                        prev = NULL;
                        n = n->head;
                    }
                }
            }

            LC_LOG_VERBOSE("END1: root[%p] prev[%p] n[%p] ti[%zu] si[%zu] word.length[%zu]",root,prev,n,ti,si,word.length());

            if (n == NULL) 
                n = root;

            LC_LOG_VERBOSE("END2: n[%p] wi[%zu] part.length[%zu]",n,wi,n->part.length());

            if (si < word.length()) {
                // not found --> add rest of word
                n->mask |= mask_;
                return add_node(n,word.substr(si),mask_,hidden_);
            }
            else if (si < (wi + n->part.length())) {
                // found, but only partially --> split + add new part
                LC_LOG_VERBOSE("found(partially)->split");
                size_t ri = (si - wi); // index relative to partial dictionary word
                std::string part = n->part;
                n->part.assign(part,0,ri);
                command_node *head__ = n->head;
                command_node *tail__ = n->tail;
                // move command node content to new node
                n->head = n->tail = NULL;
                command_node *nn = add_node(n,part.substr(ri),n->mask,n->hidden);
                nn->cmd = n->cmd;
                nn->head = head__;
                nn->tail = tail__;
                nn->start = n->start;
                // clean up current node
                n->mask |= mask_;
                n->cmd = NULL;
                n->hidden = hidden_;
                n->start = NULL;
            }
            else {
                // duplicate
                LC_LOG_VERBOSE("duplicate node");
                n->mask |= mask_;
            }

            return n;
        }
    }